

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::ExpressionsEquality1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsEquality1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  int iVar1;
  long lVar2;
  ulong *puVar3;
  TestError *pTVar4;
  long lVar5;
  string shader_source;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  ExpressionsEquality1<glcts::ArraysOfArrays::Interface::ES> *local_38;
  
  local_38 = this;
  if (supported_variable_types_map._16_8_ != 0) {
    iVar1 = *(int *)Interface::ES::var_types;
    lVar5 = 0x21e5b78;
    lVar2 = supported_variable_types_map._16_8_;
    do {
      if (iVar1 <= *(int *)(lVar2 + 0x20)) {
        lVar5 = lVar2;
      }
      lVar2 = *(long *)(lVar2 + 0x10 + (ulong)(*(int *)(lVar2 + 0x20) < iVar1) * 8);
    } while (lVar2 != 0);
    if ((lVar5 != 0x21e5b78) && (*(int *)(lVar5 + 0x20) <= iVar1)) {
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,shader_start_abi_cxx11_,DAT_021e0558 + shader_start_abi_cxx11_);
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar5 + 0x28));
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar5 + 0x28));
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar5 + 0x28));
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar5 + 0x88));
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar5 + 0x88));
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar5 + 0x28));
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar5 + 0x88));
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar5 + 0x88));
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar5 + 0x28));
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar5 + 0x28));
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar5 + 0x28));
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar5 + 0x88));
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar5 + 0x88));
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar5 + 0x28));
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar5 + 0x88));
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::_M_append((char *)local_58,*(ulong *)(lVar5 + 0x88));
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::append((char *)local_58);
      if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
        pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar4,"Unrecognized shader type.",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                   ,0xdac);
        __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      puVar3 = &set_tesseation_abi_cxx11_;
      switch((ulong)tested_shader_type) {
      case 1:
        std::__cxx11::string::append((char *)local_58);
        break;
      case 3:
        puVar3 = &emit_quad_abi_cxx11_;
      case 4:
        std::__cxx11::string::_M_append((char *)local_58,*puVar3);
      }
      std::__cxx11::string::_M_append((char *)local_58,shader_end_abi_cxx11_);
      (*(code *)(&DAT_01ac9ed8 + *(int *)(&DAT_01ac9ed8 + (ulong)tested_shader_type * 4)))();
      return;
    }
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0xdb3);
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ExpressionsEquality1<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	int num_var_types = API::n_var_types;

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string shader_source = shader_start;

			shader_source += "    ";
			shader_source += var_iterator->second.type;
			shader_source += "[][] x = ";
			shader_source += var_iterator->second.type;
			shader_source += "[][](";
			shader_source += var_iterator->second.type;
			shader_source += "[](";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += ",";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += "),";
			shader_source += var_iterator->second.type;
			shader_source += "[](";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += ",";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += "));\n";
			shader_source += "    ";
			shader_source += var_iterator->second.type;
			shader_source += "[][] y = ";
			shader_source += var_iterator->second.type;
			shader_source += "[][](";
			shader_source += var_iterator->second.type;
			shader_source += "[](";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += ",";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += "),";
			shader_source += var_iterator->second.type;
			shader_source += "[](";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += ",";
			shader_source += var_iterator->second.initializer_with_zeroes;
			shader_source += "));\n\n";
			shader_source += "    float result = 0.0;\n\n";
			shader_source += "    if (x == y)\n";
			shader_source += "    {\n";
			shader_source += "        result = 1.0;\n";
			shader_source += "    }\n";
			shader_source += "    if (y != x)\n";
			shader_source += "    {\n";
			shader_source += "        result = 2.0;\n";
			shader_source += "    }\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	}
}